

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testsc.c
# Opt level: O1

void random_read(void *vbuf,size_t size)

{
  uint8_t *puVar1;
  size_t sVar2;
  
  if (random_seedstr != (char *)0x0) {
    if (size != 0) {
      sVar2 = 0;
      do {
        if (random_buf_limit == 0) {
          random_advance_counter();
        }
        puVar1 = random_buf + random_buf_limit;
        random_buf_limit = random_buf_limit - 1;
        *(uint8_t *)((long)vbuf + sVar2) = *puVar1;
        sVar2 = sVar2 + 1;
      } while (size != sVar2);
    }
    return;
  }
  __assert_fail("random_seedstr",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/test/testsc.c",
                0x82,"void random_read(void *, size_t)");
}

Assistant:

void random_read(void *vbuf, size_t size)
{
    assert(random_seedstr);
    uint8_t *buf = (uint8_t *)vbuf;
    while (size-- > 0) {
        if (random_buf_limit == 0)
            random_advance_counter();
        *buf++ = random_buf[random_buf_limit--];
    }
}